

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixer_c.cpp
# Opt level: O1

void Mix_<CTag>(span<const_float,_18446744073709551615UL> InSamples,
               span<std::array<float,_1024UL>,_18446744073709551615UL> OutBuffer,float *CurrentGains
               ,float *TargetGains,size_t Counter,size_t OutPos)

{
  float fVar1;
  pointer paVar2;
  ulong uVar3;
  pointer pfVar4;
  ulong uVar5;
  float *pfVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  pfVar4 = InSamples.mData;
  paVar2 = OutBuffer.mData;
  fVar8 = 0.0;
  if (Counter != 0) {
    fVar8 = 1.0 / (float)Counter;
  }
  uVar3 = (long)InSamples.mDataEnd - (long)pfVar4 >> 2;
  uVar5 = uVar3;
  if (Counter < uVar3) {
    uVar5 = Counter;
  }
  if (paVar2 != OutBuffer.mDataEnd) {
    pfVar6 = paVar2->_M_elems + OutPos;
    do {
      fVar1 = *CurrentGains;
      fVar10 = *TargetGains;
      fVar9 = (fVar10 - fVar1) * fVar8;
      if (ABS(fVar9) <= 1.1920929e-07) {
        uVar7 = 0;
      }
      else {
        fVar10 = 0.0;
        uVar7 = 0;
        if (uVar5 != 0) {
          do {
            pfVar6[uVar7] = (fVar9 * fVar10 + fVar1) * pfVar4[uVar7] + pfVar6[uVar7];
            fVar10 = fVar10 + 1.0;
            uVar7 = uVar7 + 1;
          } while (uVar5 != uVar7);
        }
        if (uVar7 == Counter) {
          fVar10 = *TargetGains;
        }
        else {
          fVar10 = fVar9 * fVar10 + fVar1;
        }
      }
      *CurrentGains = fVar10;
      if (uVar7 != uVar3 && 1e-05 < ABS(fVar10)) {
        do {
          pfVar6[uVar7] = pfVar4[uVar7] * fVar10 + pfVar6[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar3 != uVar7);
      }
      CurrentGains = CurrentGains + 1;
      TargetGains = TargetGains + 1;
      paVar2 = paVar2 + 1;
      pfVar6 = pfVar6 + 0x400;
    } while (paVar2 != OutBuffer.mDataEnd);
  }
  return;
}

Assistant:

void Mix_<CTag>(const al::span<const float> InSamples, const al::span<FloatBufferLine> OutBuffer,
    float *CurrentGains, const float *TargetGains, const size_t Counter, const size_t OutPos)
{
    const float delta{(Counter > 0) ? 1.0f / static_cast<float>(Counter) : 0.0f};
    const auto min_len = minz(Counter, InSamples.size());
    for(FloatBufferLine &output : OutBuffer)
    {
        float *RESTRICT dst{al::assume_aligned<16>(output.data()+OutPos)};
        float gain{*CurrentGains};
        const float step{(*TargetGains-gain) * delta};

        size_t pos{0};
        if(!(std::fabs(step) > std::numeric_limits<float>::epsilon()))
            gain = *TargetGains;
        else
        {
            float step_count{0.0f};
            for(;pos != min_len;++pos)
            {
                dst[pos] += InSamples[pos] * (gain + step*step_count);
                step_count += 1.0f;
            }
            if(pos == Counter)
                gain = *TargetGains;
            else
                gain += step*step_count;
        }
        *CurrentGains = gain;
        ++CurrentGains;
        ++TargetGains;

        if(!(std::fabs(gain) > GainSilenceThreshold))
            continue;
        for(;pos != InSamples.size();++pos)
            dst[pos] += InSamples[pos] * gain;
    }
}